

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void textui_obj_examine(void)

{
  _Bool _Var1;
  object *local_a8;
  object *obj;
  region local_area;
  textblock *tb;
  char header_buf [120];
  
  memset(&obj,0,0x10);
  _Var1 = get_item(&local_a8,"Examine which item?","You have nothing to examine.",CMD_NULL,
                   (item_tester)0x0,L'\x1f');
  if (_Var1) {
    track_object(player->upkeep,local_a8);
    local_area._8_8_ = object_info(local_a8,OINFO_NONE);
    object_desc((char *)&tb,0x78,local_a8,0xc3,player);
    textui_textblock_show((textblock *)local_area._8_8_,_obj,(char *)&tb);
    textblock_free((textblock *)local_area._8_8_);
  }
  return;
}

Assistant:

void textui_obj_examine(void)
{
	char header_buf[120];

	textblock *tb;
	region local_area = { 0, 0, 0, 0 };

	struct object *obj;

	/* Select item */
	if (!get_item(&obj, "Examine which item?", "You have nothing to examine.",
			CMD_NULL, NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR | IS_HARMLESS)))
		return;

	/* Track object for object recall */
	track_object(player->upkeep, obj);

	/* Display info */
	tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);

	textui_textblock_show(tb, local_area, header_buf);
	textblock_free(tb);
}